

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O0

void IR::Opnd::DumpAddress(void *address,bool printToConsole,bool skipMaskedAddress)

{
  bool skipMaskedAddress_local;
  bool printToConsole_local;
  void *address_local;
  
  if (printToConsole) {
    if ((DAT_01ea40f8 & 1) == 0) {
      if (!skipMaskedAddress) {
        Output::Print(L"0xXXXXXXXX");
      }
    }
    else {
      Output::Print(L"0x%012I64X",address);
    }
  }
  return;
}

Assistant:

void
Opnd::DumpAddress(void *address, bool printToConsole, bool skipMaskedAddress)
{
    if (!printToConsole)
    {
        return;
    }

    if (!Js::Configuration::Global.flags.DumpIRAddresses)
    {
        if (skipMaskedAddress)
        {
            return;
        }
        Output::Print(_u("0xXXXXXXXX"));
    }
    else
    {
#ifdef TARGET_64
        Output::Print(_u("0x%012I64X"), address);
#else
        Output::Print(_u("0x%08X"), address);
#endif
    }
}